

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

void av1_collect_mv_stats(AV1_COMP *cpi,int current_q)

{
  int iVar1;
  AV1_COMMON *cm_00;
  undefined4 in_ESI;
  long in_RDI;
  int tile_idx;
  int tile_col;
  TileInfo tile_info;
  int tile_row;
  int tile_rows;
  int tile_cols;
  AV1_COMMON *cm;
  MV_STATS *mv_stats;
  int local_48;
  int in_stack_ffffffffffffffd0;
  int row;
  int iVar2;
  int iVar3;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  iVar3 = *(int *)(in_RDI + 0x42020);
  iVar2 = *(int *)(in_RDI + 0x42024);
  for (row = 0; row < iVar2; row = row + 1) {
    av1_tile_set_row((TileInfo *)&stack0xffffffffffffffbc,cm_00,row);
    for (local_48 = 0; local_48 < iVar3; local_48 = local_48 + 1) {
      iVar1 = row * iVar3 + local_48;
      av1_tile_set_col((TileInfo *)&stack0xffffffffffffffbc,cm_00,local_48);
      memcpy((void *)(*(long *)(in_RDI + 0x71318) + (long)iVar1 * 0x5d10 + 0x20),cm_00->fc,0x52fc);
      *(long *)(in_RDI + 0x17b68) = *(long *)(in_RDI + 0x71318) + (long)iVar1 * 0x5d10 + 0x20;
      collect_mv_stats_tile
                ((MV_STATS *)cm_00,(AV1_COMP *)CONCAT44(iVar3,iVar2),
                 (TileInfo *)CONCAT44(row,in_stack_ffffffffffffffd0));
    }
  }
  *(undefined4 *)(in_RDI + 0x9d57c) = in_ESI;
  *(undefined4 *)(in_RDI + 0x9d580) = *(undefined4 *)(in_RDI + 0x3bf84);
  *(undefined4 *)(in_RDI + 0x9d5c0) = 1;
  return;
}

Assistant:

void av1_collect_mv_stats(AV1_COMP *cpi, int current_q) {
  MV_STATS *mv_stats = &cpi->mv_stats;
  const AV1_COMMON *cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    TileInfo tile_info;
    av1_tile_set_row(&tile_info, cm, tile_row);
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      const int tile_idx = tile_row * tile_cols + tile_col;
      av1_tile_set_col(&tile_info, cm, tile_col);
      cpi->tile_data[tile_idx].tctx = *cm->fc;
      cpi->td.mb.e_mbd.tile_ctx = &cpi->tile_data[tile_idx].tctx;
      collect_mv_stats_tile(mv_stats, cpi, &tile_info);
    }
  }

  mv_stats->q = current_q;
  mv_stats->order = cpi->common.current_frame.order_hint;
  mv_stats->valid = 1;
}